

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sigproc.cc
# Opt level: O0

void sptk::snack::crossf(float *data,int size,int start,int nlags,float *engref,int *maxloc,
                        float *maxval,float *correl,int *dbsizep,float **dbdatap)

{
  float fVar1;
  int iVar2;
  float *pfVar3;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  float *in_RDI;
  float *in_R8;
  int *in_R9;
  float fVar4;
  double dVar5;
  float *in_stack_00000008;
  int total;
  int iloc;
  int i;
  double engc;
  undefined8 *in_stack_00000020;
  float amax;
  float *dds;
  float engr;
  float *p;
  float t;
  float *dq;
  int j;
  float st;
  float sum;
  float *ds;
  float *dp;
  int dbsize;
  float *dbdata;
  int local_98;
  int local_94;
  double local_90;
  float local_84;
  float local_74;
  float *local_70;
  float *local_60;
  int local_54;
  float local_4c;
  float *local_48;
  float *local_40;
  float *local_30;
  
  local_30 = (float *)*in_stack_00000020;
  iVar2 = in_ESI + in_EDX + in_ECX;
  if (*(int *)engc < iVar2) {
    if (local_30 != (float *)0x0) {
      ckfree((void *)0x13d273);
    }
    local_30 = (float *)ckalloc(0x13d292);
    if (local_30 == (float *)0x0) {
      fprintf(_stderr,"Allocation failure in crossf()\n");
      return;
    }
    *in_stack_00000020 = local_30;
    *(int *)engc = iVar2;
  }
  local_74 = 0.0;
  local_70 = in_RDI;
  local_54 = in_ESI;
  while (local_54 != 0) {
    local_74 = *local_70 + local_74;
    local_70 = local_70 + 1;
    local_54 = local_54 + -1;
  }
  local_60 = local_30;
  local_70 = in_RDI;
  local_54 = in_ESI + in_ECX + in_EDX;
  while (local_54 != 0) {
    *local_60 = *local_70 - local_74 / (float)in_ESI;
    local_70 = local_70 + 1;
    local_60 = local_60 + 1;
    local_54 = local_54 + -1;
  }
  local_40 = local_30;
  local_4c = 0.0;
  local_54 = in_ESI;
  while (fVar1 = local_4c, local_54 != 0) {
    local_4c = *local_40 * *local_40 + local_4c;
    local_54 = local_54 + -1;
    local_40 = local_40 + 1;
  }
  *in_R8 = local_4c;
  if (local_4c <= 0.0) {
    *in_R9 = 0;
    *in_stack_00000008 = 0.0;
    local_70 = _iloc;
    local_94 = in_ECX;
    while (0 < local_94) {
      *local_70 = 0.0;
      local_94 = local_94 + -1;
      local_70 = local_70 + 1;
    }
  }
  else {
    local_4c = 0.0;
    local_54 = in_ESI;
    local_40 = local_30 + in_EDX;
    while (local_54 != 0) {
      local_4c = *local_40 * *local_40 + local_4c;
      local_54 = local_54 + -1;
      local_40 = local_40 + 1;
    }
    local_90 = (double)local_4c;
    local_60 = _iloc;
    local_84 = 0.0;
    local_98 = -1;
    for (local_94 = 0; local_94 < in_ECX; local_94 = local_94 + 1) {
      local_4c = 0.0;
      local_40 = local_30;
      pfVar3 = local_30 + (long)local_94 + (long)in_EDX;
      local_54 = in_ESI;
      local_48 = pfVar3;
      while (local_54 != 0) {
        local_4c = *local_40 * *local_48 + local_4c;
        local_54 = local_54 + -1;
        local_48 = local_48 + 1;
        local_40 = local_40 + 1;
      }
      dVar5 = sqrt(local_90 * (double)fVar1);
      fVar4 = (float)((double)local_4c / dVar5);
      *local_60 = fVar4;
      local_90 = (double)(*local_48 * *local_48) + (local_90 - (double)(*pfVar3 * *pfVar3));
      if (local_90 < 1.0) {
        local_90 = 1.0;
      }
      if (local_84 < fVar4) {
        local_98 = local_94 + in_EDX;
        local_84 = fVar4;
      }
      local_60 = local_60 + 1;
    }
    *in_R9 = local_98;
    *in_stack_00000008 = local_84;
  }
  return;
}

Assistant:

void crossf(float *data, int size, int start, int nlags, float *engref,
            int *maxloc, float *maxval, float *correl, int *dbsizep,
            float **dbdatap)
#endif
{
#if 0
  static float *dbdata=NULL;
  static int dbsize = 0;
#else
  float *dbdata=*dbdatap;
  int dbsize = *dbsizep;
#endif
  register float *dp, *ds, sum, st;
  register int j;
  register  float *dq, t, *p, engr, *dds, amax;
  register  double engc;
  int i, iloc, total;
#if 0
  int sizei, sizeo, maxsize;
#endif

  /* Compute mean in reference window and subtract this from the
     entire sequence.  This doesn't do too much damage to the data
     sequenced for the purposes of F0 estimation and removes the need for
     more principled (and costly) low-cut filtering. */
  if((total = size+start+nlags) > dbsize) {
    if(dbdata)
      ckfree((void *)dbdata);
    dbdata = NULL;
    dbsize = 0;
    if(!(dbdata = (float*)ckalloc(sizeof(float)*total))) {
      Fprintf(stderr,"Allocation failure in crossf()\n");
      return;/*exit(-1);*/
    }
    dbsize = total;
#if 1
    *dbdatap = dbdata;
    *dbsizep = dbsize;
#endif
  }
  for(engr=0.0, j=size, p=data; j--; ) engr += *p++;
  engr /= size;
  for(j=size+nlags+start, dq = dbdata, p=data; j--; )  *dq++ = *p++ - engr;

#if 0
  maxsize = start + nlags;
  sizei = size + start + nlags + 1;
  sizeo = nlags + 1;
#endif
 
  /* Compute energy in reference window. */
  for(j=size, dp=dbdata, sum=0.0; j--; ) {
    st = *dp++;
    sum += st * st;
  }

  *engref = engr = sum;
  if(engr > 0.0) {    /* If there is any signal energy to work with... */
    /* Compute energy at the first requested lag. */  
    for(j=size, dp=dbdata+start, sum=0.0; j--; ) {
      st = *dp++;
      sum += st * st;
    }
    engc = sum;

    /* COMPUTE CORRELATIONS AT ALL OTHER REQUESTED LAGS. */
    for(i=0, dq=correl, amax=0.0, iloc = -1; i < nlags; i++) {
      for(j=size, sum=0.0, dp=dbdata, dds = ds = dbdata+i+start; j--; )
	sum += *dp++ * *ds++;
      *dq++ = t = (float) (sum/sqrt((double)(engc*engr))); /* output norm. CC */
      engc -= (double)(*dds * *dds); /* adjust norm. energy for next lag */
      if((engc += (double)(*ds * *ds)) < 1.0)
	engc = 1.0;		/* (hack: in case of roundoff error) */
      if(t > amax) {		/* Find abs. max. as we go. */
	amax = t;
	iloc = i+start;
      }
    }
    *maxloc = iloc;
    *maxval = amax;
  } else {	/* No energy in signal; fake reasonable return vals. */
    *maxloc = 0;
    *maxval = 0.0;
    for(p=correl,i=nlags; i-- > 0; )
      *p++ = 0.0;
  }
}